

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::Bloaty::DisassembleFunction
          (Bloaty *this,string_view function,Options *options,RollupOutput *output)

{
  pointer pIVar1;
  undefined8 uVar2;
  char cVar3;
  DataSource DVar4;
  DisassemblyInfo *info_00;
  pointer pIVar5;
  DisassemblyInfo *a0;
  string_view disassembly;
  string_view format;
  undefined1 local_100 [32];
  string local_e0;
  DisassemblyInfo info;
  
  a0 = (DisassemblyInfo *)output;
  DisassemblyInfo::DisassemblyInfo(&info);
  pIVar5 = (this->input_files_).
           super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (this->input_files_).
           super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pIVar5 == pIVar1) {
      format._M_str = local_100 + 0x20;
      format._M_len = (size_t)"Couldn\'t find function $0 to disassemble";
      local_e0._M_dataplus._M_p = (pointer)function._M_len;
      local_e0._M_string_length = (size_type)function._M_str;
      absl::Substitute_abi_cxx11_((string *)local_100,(absl *)0x28,format,(Arg *)a0);
      Throw((char *)local_100._0_8_,0x7ab);
    }
    GetObjectFile((Bloaty *)local_100,(string *)this);
    uVar2 = local_100._0_8_;
    DVar4 = EffectiveSymbolSource(options);
    a0 = &info;
    cVar3 = (**(code **)(*(long *)uVar2 + 0x20))
                      (uVar2,(Arena *)function._M_len,function._M_str,DVar4);
    if (cVar3 != '\0') break;
    if ((InputFileFactory *)local_100._0_8_ != (InputFileFactory *)0x0) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
    pIVar5 = pIVar5 + 1;
  }
  DisassembleFunction_abi_cxx11_((string *)(local_100 + 0x20),(bloaty *)&info,info_00);
  disassembly._M_str = local_e0._M_dataplus._M_p;
  disassembly._M_len = local_e0._M_string_length;
  RollupOutput::SetDisassembly(output,disassembly);
  std::__cxx11::string::~string((string *)(local_100 + 0x20));
  if ((InputFileFactory *)local_100._0_8_ != (InputFileFactory *)0x0) {
    (**(code **)(*(long *)local_100._0_8_ + 8))();
  }
  DualMap::~DualMap(&info.symbol_map);
  return;
}

Assistant:

void Bloaty::DisassembleFunction(string_view function, const Options& options,
                                 RollupOutput* output) {
  DisassemblyInfo info;
  for (const auto& file_info : input_files_) {
    auto file = GetObjectFile(file_info.filename_);
    if (file->GetDisassemblyInfo(function, EffectiveSymbolSource(options),
                                 &info)) {
      output->SetDisassembly(::bloaty::DisassembleFunction(info));
      return;
    }
  }

  THROWF("Couldn't find function $0 to disassemble", function);
}